

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O3

void aom_smooth_h_predictor_8x4_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  undefined4 uVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  short sVar10;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  undefined1 auVar11 [16];
  short sVar18;
  short sVar19;
  short sVar21;
  undefined1 auVar20 [16];
  ushort uVar22;
  ushort uVar23;
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  ushort uVar35;
  ushort uVar36;
  ushort uVar37;
  ushort uVar38;
  undefined1 auVar24 [16];
  
  auVar11 = pshuflw(ZEXT116(top_row[7]),ZEXT116(top_row[7]),0);
  uVar1 = *(undefined4 *)left_column;
  auVar20 = ZEXT716(CONCAT52(CONCAT41((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((uint)
                                                  uVar1 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)uVar1 >> 0x10),uVar1)) >>
                                                  0x20),uVar1) >> 0x18),(char)((uint)uVar1 >> 8)),
                             (ushort)(byte)uVar1) & 0xffffff00ffffff);
  sVar17 = auVar11._0_2_;
  sVar18 = auVar11._2_2_;
  auVar11 = pshuflw((undefined1  [16])0x0,auVar20,0);
  sVar10 = sVar17 + 0x80;
  sVar12 = sVar18 * 0x3b + 0x80;
  sVar13 = sVar17 * 0x6e + 0x80;
  sVar14 = sVar18 * 0x97 + 0x80;
  sVar15 = sVar17 * 0xb7 + 0x80;
  sVar16 = sVar18 * 0xce + 0x80;
  sVar17 = sVar17 * 0xdb + 0x80;
  sVar18 = sVar18 * 0xe0 + 0x80;
  sVar19 = auVar11._0_2_;
  sVar21 = auVar11._2_2_;
  uVar22 = sVar19 * 0xff + sVar10;
  uVar25 = sVar21 * 0xc5 + sVar12;
  uVar27 = sVar19 * 0x92 + sVar13;
  uVar29 = sVar21 * 0x69 + sVar14;
  uVar31 = sVar19 * 0x49 + sVar15;
  uVar33 = sVar21 * 0x32 + sVar16;
  uVar35 = sVar19 * 0x25 + sVar17;
  uVar37 = sVar21 * 0x20 + sVar18;
  uVar23 = uVar22 >> 8;
  uVar26 = uVar25 >> 8;
  uVar28 = uVar27 >> 8;
  uVar30 = uVar29 >> 8;
  uVar32 = uVar31 >> 8;
  uVar34 = uVar33 >> 8;
  uVar36 = uVar35 >> 8;
  uVar38 = uVar37 >> 8;
  cVar2 = (char)(uVar22 >> 8);
  cVar3 = (char)(uVar25 >> 8);
  cVar4 = (char)(uVar27 >> 8);
  cVar5 = (char)(uVar29 >> 8);
  cVar6 = (char)(uVar31 >> 8);
  cVar7 = (char)(uVar33 >> 8);
  cVar8 = (char)(uVar35 >> 8);
  cVar9 = (char)(uVar37 >> 8);
  auVar11._0_8_ =
       CONCAT17((uVar38 != 0) * (uVar38 < 0x100) * cVar9 - (0xff < uVar38),
                CONCAT16((uVar36 != 0) * (uVar36 < 0x100) * cVar8 - (0xff < uVar36),
                         CONCAT15((uVar34 != 0) * (uVar34 < 0x100) * cVar7 - (0xff < uVar34),
                                  CONCAT14((uVar32 != 0) * (uVar32 < 0x100) * cVar6 -
                                           (0xff < uVar32),
                                           CONCAT13((uVar30 != 0) * (uVar30 < 0x100) * cVar5 -
                                                    (0xff < uVar30),
                                                    CONCAT12((uVar28 != 0) * (uVar28 < 0x100) *
                                                             cVar4 - (0xff < uVar28),
                                                             CONCAT11((uVar26 != 0) *
                                                                      (uVar26 < 0x100) * cVar3 -
                                                                      (0xff < uVar26),
                                                                      (uVar23 != 0) *
                                                                      (uVar23 < 0x100) * cVar2 -
                                                                      (0xff < uVar23))))))));
  auVar11[8] = (uVar23 != 0) * (uVar23 < 0x100) * cVar2 - (0xff < uVar23);
  auVar11[9] = (uVar26 != 0) * (uVar26 < 0x100) * cVar3 - (0xff < uVar26);
  auVar11[10] = (uVar28 != 0) * (uVar28 < 0x100) * cVar4 - (0xff < uVar28);
  auVar11[0xb] = (uVar30 != 0) * (uVar30 < 0x100) * cVar5 - (0xff < uVar30);
  auVar11[0xc] = (uVar32 != 0) * (uVar32 < 0x100) * cVar6 - (0xff < uVar32);
  auVar11[0xd] = (uVar34 != 0) * (uVar34 < 0x100) * cVar7 - (0xff < uVar34);
  auVar11[0xe] = (uVar36 != 0) * (uVar36 < 0x100) * cVar8 - (0xff < uVar36);
  auVar11[0xf] = (uVar38 != 0) * (uVar38 < 0x100) * cVar9 - (0xff < uVar38);
  *(undefined8 *)dst = auVar11._0_8_;
  auVar11 = pshuflw(auVar11,auVar20,0x55);
  sVar19 = auVar11._0_2_;
  sVar21 = auVar11._2_2_;
  uVar22 = sVar19 * 0xff + sVar10;
  uVar25 = sVar21 * 0xc5 + sVar12;
  uVar27 = sVar19 * 0x92 + sVar13;
  uVar29 = sVar21 * 0x69 + sVar14;
  uVar31 = sVar19 * 0x49 + sVar15;
  uVar33 = sVar21 * 0x32 + sVar16;
  uVar35 = sVar19 * 0x25 + sVar17;
  uVar37 = sVar21 * 0x20 + sVar18;
  uVar23 = uVar22 >> 8;
  uVar26 = uVar25 >> 8;
  uVar28 = uVar27 >> 8;
  uVar30 = uVar29 >> 8;
  uVar32 = uVar31 >> 8;
  uVar34 = uVar33 >> 8;
  uVar36 = uVar35 >> 8;
  uVar38 = uVar37 >> 8;
  cVar2 = (char)(uVar22 >> 8);
  cVar3 = (char)(uVar25 >> 8);
  cVar4 = (char)(uVar27 >> 8);
  cVar5 = (char)(uVar29 >> 8);
  cVar6 = (char)(uVar31 >> 8);
  cVar7 = (char)(uVar33 >> 8);
  cVar8 = (char)(uVar35 >> 8);
  cVar9 = (char)(uVar37 >> 8);
  auVar24._0_8_ =
       CONCAT17((uVar38 != 0) * (uVar38 < 0x100) * cVar9 - (0xff < uVar38),
                CONCAT16((uVar36 != 0) * (uVar36 < 0x100) * cVar8 - (0xff < uVar36),
                         CONCAT15((uVar34 != 0) * (uVar34 < 0x100) * cVar7 - (0xff < uVar34),
                                  CONCAT14((uVar32 != 0) * (uVar32 < 0x100) * cVar6 -
                                           (0xff < uVar32),
                                           CONCAT13((uVar30 != 0) * (uVar30 < 0x100) * cVar5 -
                                                    (0xff < uVar30),
                                                    CONCAT12((uVar28 != 0) * (uVar28 < 0x100) *
                                                             cVar4 - (0xff < uVar28),
                                                             CONCAT11((uVar26 != 0) *
                                                                      (uVar26 < 0x100) * cVar3 -
                                                                      (0xff < uVar26),
                                                                      (uVar23 != 0) *
                                                                      (uVar23 < 0x100) * cVar2 -
                                                                      (0xff < uVar23))))))));
  auVar24[8] = (uVar23 != 0) * (uVar23 < 0x100) * cVar2 - (0xff < uVar23);
  auVar24[9] = (uVar26 != 0) * (uVar26 < 0x100) * cVar3 - (0xff < uVar26);
  auVar24[10] = (uVar28 != 0) * (uVar28 < 0x100) * cVar4 - (0xff < uVar28);
  auVar24[0xb] = (uVar30 != 0) * (uVar30 < 0x100) * cVar5 - (0xff < uVar30);
  auVar24[0xc] = (uVar32 != 0) * (uVar32 < 0x100) * cVar6 - (0xff < uVar32);
  auVar24[0xd] = (uVar34 != 0) * (uVar34 < 0x100) * cVar7 - (0xff < uVar34);
  auVar24[0xe] = (uVar36 != 0) * (uVar36 < 0x100) * cVar8 - (0xff < uVar36);
  auVar24[0xf] = (uVar38 != 0) * (uVar38 < 0x100) * cVar9 - (0xff < uVar38);
  *(undefined8 *)(dst + stride) = auVar24._0_8_;
  auVar11 = pshuflw(auVar24,auVar20,0xaa);
  sVar19 = auVar11._0_2_;
  sVar21 = auVar11._2_2_;
  uVar22 = sVar19 * 0xff + sVar10;
  uVar25 = sVar21 * 0xc5 + sVar12;
  uVar27 = sVar19 * 0x92 + sVar13;
  uVar29 = sVar21 * 0x69 + sVar14;
  uVar31 = sVar19 * 0x49 + sVar15;
  uVar33 = sVar21 * 0x32 + sVar16;
  uVar35 = sVar19 * 0x25 + sVar17;
  uVar37 = sVar21 * 0x20 + sVar18;
  uVar23 = uVar22 >> 8;
  uVar26 = uVar25 >> 8;
  uVar28 = uVar27 >> 8;
  uVar30 = uVar29 >> 8;
  uVar32 = uVar31 >> 8;
  uVar34 = uVar33 >> 8;
  uVar36 = uVar35 >> 8;
  uVar38 = uVar37 >> 8;
  *(ulong *)(dst + stride * 2) =
       CONCAT17((uVar38 != 0) * (uVar38 < 0x100) * (char)(uVar37 >> 8) - (0xff < uVar38),
                CONCAT16((uVar36 != 0) * (uVar36 < 0x100) * (char)(uVar35 >> 8) - (0xff < uVar36),
                         CONCAT15((uVar34 != 0) * (uVar34 < 0x100) * (char)(uVar33 >> 8) -
                                  (0xff < uVar34),
                                  CONCAT14((uVar32 != 0) * (uVar32 < 0x100) * (char)(uVar31 >> 8) -
                                           (0xff < uVar32),
                                           CONCAT13((uVar30 != 0) * (uVar30 < 0x100) *
                                                    (char)(uVar29 >> 8) - (0xff < uVar30),
                                                    CONCAT12((uVar28 != 0) * (uVar28 < 0x100) *
                                                             (char)(uVar27 >> 8) - (0xff < uVar28),
                                                             CONCAT11((uVar26 != 0) *
                                                                      (uVar26 < 0x100) *
                                                                      (char)(uVar25 >> 8) -
                                                                      (0xff < uVar26),
                                                                      (uVar23 != 0) *
                                                                      (uVar23 < 0x100) *
                                                                      (char)(uVar22 >> 8) -
                                                                      (0xff < uVar23))))))));
  auVar11 = pshuflw(auVar20,auVar20,0xff);
  sVar19 = auVar11._0_2_;
  sVar21 = auVar11._2_2_;
  uVar22 = sVar19 * 0xff + sVar10;
  uVar25 = sVar21 * 0xc5 + sVar12;
  uVar27 = sVar19 * 0x92 + sVar13;
  uVar29 = sVar21 * 0x69 + sVar14;
  uVar31 = sVar19 * 0x49 + sVar15;
  uVar33 = sVar21 * 0x32 + sVar16;
  uVar35 = sVar19 * 0x25 + sVar17;
  uVar37 = sVar21 * 0x20 + sVar18;
  uVar23 = uVar22 >> 8;
  uVar26 = uVar25 >> 8;
  uVar28 = uVar27 >> 8;
  uVar30 = uVar29 >> 8;
  uVar32 = uVar31 >> 8;
  uVar34 = uVar33 >> 8;
  uVar36 = uVar35 >> 8;
  uVar38 = uVar37 >> 8;
  *(ulong *)(dst + stride * 3) =
       CONCAT17((uVar38 != 0) * (uVar38 < 0x100) * (char)(uVar37 >> 8) - (0xff < uVar38),
                CONCAT16((uVar36 != 0) * (uVar36 < 0x100) * (char)(uVar35 >> 8) - (0xff < uVar36),
                         CONCAT15((uVar34 != 0) * (uVar34 < 0x100) * (char)(uVar33 >> 8) -
                                  (0xff < uVar34),
                                  CONCAT14((uVar32 != 0) * (uVar32 < 0x100) * (char)(uVar31 >> 8) -
                                           (0xff < uVar32),
                                           CONCAT13((uVar30 != 0) * (uVar30 < 0x100) *
                                                    (char)(uVar29 >> 8) - (0xff < uVar30),
                                                    CONCAT12((uVar28 != 0) * (uVar28 < 0x100) *
                                                             (char)(uVar27 >> 8) - (0xff < uVar28),
                                                             CONCAT11((uVar26 != 0) *
                                                                      (uVar26 < 0x100) *
                                                                      (char)(uVar25 >> 8) -
                                                                      (0xff < uVar26),
                                                                      (uVar23 != 0) *
                                                                      (uVar23 < 0x100) *
                                                                      (char)(uVar22 >> 8) -
                                                                      (0xff < uVar23))))))));
  return;
}

Assistant:

void aom_smooth_h_predictor_8x4_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i top_right = _mm_set1_epi16(top_row[7]);
  const __m128i left = cvtepu8_epi16(Load4(left_column));
  const __m128i weights = cvtepu8_epi16(LoadLo8(smooth_weights + 4));
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i inverted_weights = _mm_sub_epi16(scale, weights);
  const __m128i scaled_top_right = _mm_mullo_epi16(inverted_weights, top_right);
  const __m128i round = _mm_set1_epi16(1 << (SMOOTH_WEIGHT_LOG2_SCALE - 1));
  __m128i y_select = _mm_set1_epi32(0x01000100);
  __m128i left_y = _mm_shuffle_epi8(left, y_select);
  write_smooth_directional_sum8(dst, &left_y, &weights, &scaled_top_right,
                                &round);
  dst += stride;
  y_select = _mm_set1_epi32(0x03020302);
  left_y = _mm_shuffle_epi8(left, y_select);
  write_smooth_directional_sum8(dst, &left_y, &weights, &scaled_top_right,
                                &round);
  dst += stride;
  y_select = _mm_set1_epi32(0x05040504);
  left_y = _mm_shuffle_epi8(left, y_select);
  write_smooth_directional_sum8(dst, &left_y, &weights, &scaled_top_right,
                                &round);
  dst += stride;
  y_select = _mm_set1_epi32(0x07060706);
  left_y = _mm_shuffle_epi8(left, y_select);
  write_smooth_directional_sum8(dst, &left_y, &weights, &scaled_top_right,
                                &round);
}